

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.c
# Opt level: O0

void logevent(LogContext *ctx,char *event)

{
  char *pcVar1;
  bool bVar2;
  char *local_30;
  char *q;
  char *p;
  char *dup;
  char *event_local;
  LogContext *ctx_local;
  
  if (ctx != (LogContext *)0x0) {
    pcVar1 = strchr(event,10);
    if ((pcVar1 == (char *)0x0) && (pcVar1 = strchr(event,0xd), pcVar1 == (char *)0x0)) {
      logevent_internal(ctx,event);
    }
    else {
      pcVar1 = dupstr(event);
      local_30 = pcVar1;
      q = pcVar1;
      while (*q != '\0') {
        if ((*q == '\r') || (*q == '\n')) {
          do {
            q = q + 1;
            bVar2 = true;
            if (*q != '\r') {
              bVar2 = *q == '\n';
            }
          } while (bVar2);
          *local_30 = ' ';
        }
        else {
          *local_30 = *q;
          q = q + 1;
        }
        local_30 = local_30 + 1;
      }
      *local_30 = '\0';
      logevent_internal(ctx,pcVar1);
      safefree(pcVar1);
    }
  }
  return;
}

Assistant:

void logevent(LogContext *ctx, const char *event)
{
    if (!ctx)
        return;

    /*
     * Replace newlines in Event Log messages with spaces. (Sometimes
     * the same message string is reused for the Event Log and a GUI
     * dialog box; newlines are sometimes appropriate in the latter,
     * but never in the former.)
     */
    if (strchr(event, '\n') || strchr(event, '\r')) {
        char *dup = dupstr(event);
        char *p = dup, *q = dup;
        while (*p) {
            if (*p == '\r' || *p == '\n') {
                do {
                    p++;
                } while (*p == '\r' || *p == '\n');
                *q++ = ' ';
            } else {
                *q++ = *p++;
            }
        }
        *q = '\0';
        logevent_internal(ctx, dup);
        sfree(dup);
    } else {
        logevent_internal(ctx, event);
    }
}